

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O3

void SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>const>>
               (DataStream *s,
               ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> *args
               )

{
  long in_FS_OFFSET;
  SizeComputer sizecomp;
  uint64_t local_40;
  TransactionSerParams *local_38;
  DataStream *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (DataStream *)&local_40;
  local_40 = 0;
  local_38 = args->m_params;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((args->m_object->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_38,local_38);
  WriteCompactSize<DataStream>(s,local_40);
  local_38 = args->m_params;
  local_30 = s;
  SerializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>
            ((args->m_object->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,(ParamsStream<DataStream_&,_TransactionSerParams> *)&local_38,local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}